

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  uv__queue **ppuVar2;
  uint uVar3;
  uint uVar4;
  uv__queue *puVar5;
  ulong uVar6;
  ssize_t sVar7;
  int *piVar8;
  cmsghdr *__cmsg;
  int iVar9;
  ulong uVar10;
  uv_stream_t *stream;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  msghdr msg;
  int error;
  uv_buf_t local_1a8;
  uv_stream_t *local_198;
  uv__io_t *local_190;
  ulong local_188;
  ulong local_180;
  size_t local_178;
  msghdr local_170;
  cmsghdr local_138 [16];
  
  uVar3 = *(uint *)&w[-2].watcher_queue.next;
  if ((0xe < uVar3) || ((0x5080U >> (uVar3 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a7,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (((ulong)w[-1].pending_queue.next & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a8,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)&w[-2].pending_queue;
  lVar11._0_4_ = w[-1].pevents;
  lVar11._4_4_ = w[-1].events;
  if (lVar11 != 0) {
    lVar11 = *(long *)&w[-1].pevents;
    local_170.msg_name = (void *)CONCAT44(local_170.msg_name._4_4_,4);
    iVar12 = *(int *)&w[-2].watcher_queue.next;
    if ((iVar12 != 7) && (iVar12 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4de,"void uv__stream_connect(uv_stream_t *)");
    }
    if (lVar11 == 0) {
      __assert_fail("req",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4df,"void uv__stream_connect(uv_stream_t *)");
    }
    if (w[1].pevents == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x4ea,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_138,(socklen_t *)&local_170);
      local_138[0].cmsg_len = CONCAT44(local_138[0].cmsg_len._4_4_,-(int)local_138[0].cmsg_len);
    }
    else {
      local_138[0].cmsg_len = CONCAT44(local_138[0].cmsg_len._4_4_,w[1].pevents);
      w[1].pevents = 0;
    }
    if ((int)local_138[0].cmsg_len == -0x73) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    puVar5 = w[-2].pending_queue.prev;
    iVar12 = *(int *)&puVar5[2].next;
    if (iVar12 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4f7,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)&puVar5[2].next = iVar12 + -1;
    if (((int)local_138[0].cmsg_len < 0) || ((uv__io_t *)w[1].cb == w + 1)) {
      uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,4);
    }
    if (*(code **)(lVar11 + 0x48) != (code *)0x0) {
      (**(code **)(lVar11 + 0x48))(lVar11,local_138[0].cmsg_len & 0xffffffff);
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)local_138[0].cmsg_len) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  if (w->fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4af,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    pbVar1 = (byte *)((long)&w[-1].pending_queue.next + 1);
    *pbVar1 = *pbVar1 & 0xfb;
    uVar14 = 0;
    if (*(int *)&w[-2].watcher_queue.next == 7) {
      uVar14 = (ulong)(*(int *)&w[2].cb != 0);
    }
    iVar12 = 0x20;
    local_198 = stream;
    local_190 = w;
    local_188 = uVar14;
LAB_00116cc0:
    if (((w[-1].watcher_queue.prev != (uv__queue *)0x0) &&
        (((ulong)w[-1].pending_queue.next & 0x1000) != 0)) &&
       (bVar15 = iVar12 != 0, iVar12 = iVar12 + -1, bVar15)) {
      if (w[-1].watcher_queue.next == (uv__queue *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x414,"void uv__read(uv_stream_t *)");
      }
      local_1a8 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue.next)(stream,0x10000,&local_1a8);
      if ((local_1a8.base == (char *)0x0) || (local_1a8.len == 0)) {
        lVar11 = -0x69;
        goto LAB_00117128;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x41f,"void uv__read(uv_stream_t *)");
      }
      if ((char)uVar14 == '\0') {
        do {
          sVar7 = read(w->fd,local_1a8.base,local_1a8.len);
          if (-1 < sVar7) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
      else {
        local_170.msg_flags = 0;
        local_170.msg_iov = (iovec *)&local_1a8;
        local_170.msg_iovlen = 1;
        local_170.msg_name = (void *)0x0;
        local_170.msg_namelen = 0;
        local_170.msg_controllen = 0x100;
        local_170.msg_control = local_138;
        do {
          sVar7 = uv__recvmsg(w->fd,&local_170,0);
          if (-1 < sVar7) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
      if (sVar7 < 0) {
        piVar8 = __errno_location();
        uVar3 = *(uint *)&w[-1].pending_queue.next;
        if (*piVar8 == 0xb) {
          if ((uVar3 >> 0xc & 1) != 0) {
            uv__io_start((uv_loop_t *)w[-2].pending_queue.prev,w,1);
          }
          lVar11 = 0;
          goto LAB_00117128;
        }
        *(uint *)&w[-1].pending_queue.next = uVar3 & 0xffff3fff;
        (*(code *)w[-1].watcher_queue.prev)(stream,-(long)*piVar8,&local_1a8);
        uVar3 = *(uint *)&w[-1].pending_queue.next;
        if ((uVar3 >> 0xc & 1) != 0) {
          *(uint *)&w[-1].pending_queue.next = uVar3 & 0xffffefff;
          uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,1);
          uVar3 = *(uint *)&w[-1].pending_queue.next;
          if (((uVar3 & 4) != 0) &&
             (*(uint *)&w[-1].pending_queue.next = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
            ppuVar2 = &(w[-2].pending_queue.prev)->prev;
            *(int *)ppuVar2 = *(int *)ppuVar2 + -1;
          }
        }
      }
      else {
        if (sVar7 != 0) {
          local_178 = local_1a8.len;
          if ((char)uVar14 != '\0') {
            iVar9 = 0;
            __cmsg = (cmsghdr *)local_170.msg_control;
            if ((cmsghdr *)local_170.msg_control != (cmsghdr *)0x0 && 0xf < local_170.msg_controllen
               ) {
              do {
                if (__cmsg->cmsg_type == 1) {
                  uVar14 = __cmsg->cmsg_len;
                  if (uVar14 < 0x10) {
                    __assert_fail("cmsg->cmsg_len >= CMSG_LEN(0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                                  ,0x3e2,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)")
                    ;
                  }
                  if ((uVar14 & 3) != 0) {
                    __assert_fail("count % sizeof(fd) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                                  ,0x3e4,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)")
                    ;
                  }
                  if (uVar14 - 0x10 != 0) {
                    local_180 = uVar14 - 0x10 >> 2;
                    uVar13 = local_180 + (local_180 == 0);
                    uVar10 = 0;
                    do {
                      uVar3 = *(uint *)((long)&__cmsg[1].cmsg_len + uVar10 * 4);
                      if (w[1].events == 0xffffffff) {
                        w[1].events = uVar3;
                      }
                      else {
                        piVar8 = *(int **)&w[1].fd;
                        if (piVar8 == (int *)0x0) {
                          piVar8 = (int *)uv__malloc(0x28);
                          if (piVar8 != (int *)0x0) {
                            piVar8[0] = 8;
                            piVar8[1] = 0;
                            goto LAB_00116ea4;
                          }
LAB_00116ebd:
                          iVar9 = -0xc;
                          bVar15 = false;
                        }
                        else {
                          iVar9 = *piVar8;
                          if (iVar9 == piVar8[1]) {
                            piVar8 = (int *)uv__realloc(piVar8,(ulong)(iVar9 + 7) * 4 + 0xc);
                            if (piVar8 == (int *)0x0) goto LAB_00116ebd;
                            *piVar8 = iVar9 + 8;
                            w = local_190;
LAB_00116ea4:
                            *(int **)&w[1].fd = piVar8;
                          }
                          uVar4 = piVar8[1];
                          piVar8[1] = uVar4 + 1;
                          piVar8[(ulong)uVar4 + 2] = uVar3;
                          iVar9 = 0;
                          bVar15 = true;
                        }
                        uVar6 = local_180;
                        w = local_190;
                        uVar14 = local_188;
                        if (!bVar15) goto joined_r0x00116f28;
                      }
                      uVar10 = uVar10 + 1;
                      w = local_190;
                    } while (uVar13 != uVar10);
                  }
                }
                else {
                  fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
                }
                __cmsg = __cmsg_nxthdr((msghdr *)&local_170,__cmsg);
              } while (__cmsg != (cmsghdr *)0x0);
              iVar9 = 0;
              uVar14 = local_188;
            }
            goto LAB_00116f72;
          }
          goto LAB_00116f7a;
        }
        uv__stream_eof(stream,&local_1a8);
      }
    }
  }
LAB_0011712c:
  if (w->fd != -1) {
    if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue.next & 0x1c00) == 0x1400)) {
      local_138[0].cmsg_len = 0;
      local_138[0].cmsg_level = 0;
      local_138[0].cmsg_type = 0;
      uv__stream_eof(stream,(uv_buf_t *)local_138);
    }
    if (((events & 0x1c) != 0) && (w->fd != -1)) {
      uv__write(stream);
      uv__write_callbacks(stream);
      if ((uv__io_t *)w[1].cb == w + 1) {
        uv__drain(stream);
      }
    }
  }
  return;
joined_r0x00116f28:
  for (; local_190 = w, local_188 = uVar14, uVar10 < uVar6; uVar10 = uVar10 + 1) {
    uv__close(uVar3);
    w = local_190;
    uVar14 = local_188;
  }
LAB_00116f72:
  stream = local_198;
  if (iVar9 != 0) {
    lVar11 = (long)iVar9;
LAB_00117128:
    (*(code *)w[-1].watcher_queue.prev)(stream,lVar11,&local_1a8);
    goto LAB_0011712c;
  }
LAB_00116f7a:
  (*(code *)w[-1].watcher_queue.prev)(stream,sVar7,&local_1a8);
  if (sVar7 < (long)local_178) goto LAB_001170b8;
  goto LAB_00116cc0;
LAB_001170b8:
  pbVar1 = (byte *)((long)&w[-1].pending_queue.next + 1);
  *pbVar1 = *pbVar1 | 4;
  goto LAB_0011712c;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (uv__queue_empty(&stream->write_queue))
      uv__drain(stream);
  }
}